

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_call_bound_function
                  (JSContext *ctx,JSValue func_obj,JSValue this_obj,int argc,JSValue *argv,int flags
                  )

{
  undefined8 *puVar1;
  int iVar2;
  JSValueUnion *pJVar3;
  undefined8 uVar4;
  JSValueUnion JVar5;
  BOOL BVar6;
  JSValueUnion JVar7;
  long lVar8;
  void *pvVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  JSValueUnion *pJVar13;
  JSValue JVar14;
  JSValue JVar15;
  long lStack_70;
  JSValueUnion aJStack_68 [2];
  long lStack_58;
  int aiStack_50 [2];
  JSValueUnion local_48 [2];
  void *local_38;
  
  JVar7 = this_obj.u;
  pJVar3 = *(JSValueUnion **)((long)func_obj.u.ptr + 0x30);
  lVar12 = (long)argc + (long)pJVar3[4].int32;
  if (&stack0xfffffffffffffff8 + lVar12 * -0x10 < (undefined1 *)ctx->rt->stack_limit) {
    aiStack_50[0] = 0x118071;
    aiStack_50[1] = 0;
    JS_ThrowInternalError(ctx,"stack overflow");
    JVar14 = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    pJVar13 = local_48 + lVar12 * -2;
    if (0 < pJVar3[4].int32) {
      lVar11 = 0;
      lVar8 = 0;
      do {
        puVar1 = (undefined8 *)((long)pJVar3 + lVar11 + 0x28);
        uVar4 = puVar1[1];
        *(undefined8 *)((long)pJVar13 + lVar11) = *puVar1;
        ((undefined8 *)((long)pJVar13 + lVar11))[1] = uVar4;
        lVar8 = lVar8 + 1;
        lVar11 = lVar11 + 0x10;
      } while (lVar8 < pJVar3[4].int32);
    }
    if (0 < argc) {
      uVar10 = 0;
      do {
        iVar2 = pJVar3[4].int32;
        JVar5 = (JSValueUnion)argv->tag;
        pJVar13[((long)iVar2 + uVar10) * 2] = argv->u;
        (pJVar13 + ((long)iVar2 + uVar10) * 2)[1] = JVar5;
        uVar10 = uVar10 + 1;
        argv = argv + 1;
      } while ((uint)argc != uVar10);
    }
    if ((flags & 1U) == 0) {
      JVar14 = *(JSValue *)pJVar3;
      JVar15 = *(JSValue *)(pJVar3 + 2);
      local_48[0].int32 = 0;
      local_48[1] = (JSValueUnion)0x3;
      aJStack_68[lVar12 * -2].ptr = (void *)((ulong)(uint)local_48[0]._4_4_ << 0x20);
      aJStack_68[lVar12 * 0xfffffffffffffffeU + 1] = (JSValueUnion)0x3;
      (&lStack_58)[lVar12 * -2] = (long)pJVar13;
      aiStack_50[lVar12 * -4] = 2;
      (&lStack_70)[lVar12 * -2] = 0x11812f;
      JVar14 = JS_CallInternal(ctx,JVar14,JVar15,*(JSValue *)(aJStack_68 + lVar12 * -2),(int)lVar12,
                               (JSValue *)(&lStack_58)[lVar12 * -2],aiStack_50[lVar12 * -4]);
    }
    else {
      local_38 = (void *)this_obj.tag;
      (aiStack_50 + lVar12 * -4)[0] = 0x118144;
      (aiStack_50 + lVar12 * -4)[1] = 0;
      BVar6 = js_same_value(ctx,func_obj,this_obj);
      pvVar9 = local_38;
      if (BVar6 != 0) {
        JVar7 = (JSValueUnion)pJVar3->ptr;
        pvVar9 = pJVar3[1].ptr;
      }
      JVar14 = *(JSValue *)pJVar3;
      (aiStack_50 + lVar12 * -4)[0] = 2;
      (aiStack_50 + lVar12 * -4)[1] = 0;
      (&lStack_58)[lVar12 * -2] = (long)pJVar13;
      aJStack_68[lVar12 * 0xfffffffffffffffeU + 1] = (JSValueUnion)0x11816e;
      JVar15.tag = (int64_t)pvVar9;
      JVar15.u.float64 = JVar7.float64;
      JVar14 = JS_CallConstructorInternal
                         (ctx,JVar14,JVar15,(int)lVar12,(JSValue *)(&lStack_58)[lVar12 * -2],
                          aiStack_50[lVar12 * -4]);
    }
  }
  return JVar14;
}

Assistant:

static JSValue js_call_bound_function(JSContext *ctx, JSValueConst func_obj,
                                      JSValueConst this_obj,
                                      int argc, JSValueConst *argv, int flags)
{
    JSObject *p;
    JSBoundFunction *bf;
    JSValueConst *arg_buf, new_target;
    int arg_count, i;

    p = JS_VALUE_GET_OBJ(func_obj);
    bf = p->u.bound_function;
    arg_count = bf->argc + argc;
    if (js_check_stack_overflow(ctx->rt, sizeof(JSValue) * arg_count))
        return JS_ThrowStackOverflow(ctx);
    arg_buf = alloca(sizeof(JSValue) * arg_count);
    for(i = 0; i < bf->argc; i++) {
        arg_buf[i] = bf->argv[i];
    }
    for(i = 0; i < argc; i++) {
        arg_buf[bf->argc + i] = argv[i];
    }
    if (flags & JS_CALL_FLAG_CONSTRUCTOR) {
        new_target = this_obj;
        if (js_same_value(ctx, func_obj, new_target))
            new_target = bf->func_obj;
        return JS_CallConstructor2(ctx, bf->func_obj, new_target,
                                   arg_count, arg_buf);
    } else {
        return JS_Call(ctx, bf->func_obj, bf->this_val,
                       arg_count, arg_buf);
    }
}